

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O2

void __thiscall quantum::QuantumComputer::resetState(QuantumComputer *this)

{
  pointer pdVar1;
  reference pvVar2;
  pointer pdVar3;
  
  pdVar1 = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar3 < pdVar1; pdVar3 = pdVar3 + 1) {
    *pdVar3 = 0.0;
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::at(&this->baseVector,0);
  *pvVar2 = 1.0;
  return;
}

Assistant:

void quantum::QuantumComputer::resetState() {
    std::vector<double>::iterator it;
    for (it = this->baseVector.begin(); it < this->baseVector.end(); it++) {
        *it = 0.0;
    }
    this->baseVector.at(0) = 1;
}